

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  pointer pcVar1;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  cmUVProcessChainBuilder *pcVar7;
  size_t sVar8;
  uv_loop_t *puVar9;
  ulong uVar10;
  Status *this;
  ostream *poVar11;
  bool timedOut;
  cmProcessOutput processOutput;
  bool errFinished;
  bool outFinished;
  OutputOption outputflag_local;
  undefined1 local_1b8 [8];
  cmUVProcessChain chain;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  anon_class_24_3_3cd7b453 startRead;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  uv_timer_ptr timer;
  uv_pipe_ptr errStream;
  uv_pipe_ptr outStream;
  string local_108;
  string local_e8;
  string local_c8;
  rep local_a8;
  cmUVProcessChainBuilder builder;
  
  outputflag_local = outputflag;
  local_a8 = timeout.__r;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  pcVar7 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_INPUT,_stdin);
  cmUVProcessChainBuilder::AddCommand(pcVar7,command);
  if (dir != (char *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar8 = strlen(dir);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,dir,dir + sVar8);
    cmUVProcessChainBuilder::SetWorkingDirectory(&builder,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (outputflag_local != OUTPUT_MERGE) {
    if (outputflag_local == OUTPUT_PASSTHROUGH) {
      pcVar7 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_OUTPUT,_stdout);
      cmUVProcessChainBuilder::SetExternalStream(pcVar7,Stream_ERROR,_stderr);
      captureStdErr = (string *)0x0;
      captureStdOut = (string *)0x0;
      goto LAB_001125fa;
    }
    if (captureStdErr != captureStdOut || captureStdErr == (string *)0x0) {
      pcVar7 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
      cmUVProcessChainBuilder::SetBuiltinStream(pcVar7,Stream_ERROR);
      goto LAB_001125fa;
    }
  }
  cmUVProcessChainBuilder::SetMergedBuiltinStreams(&builder);
  captureStdErr = (string *)0x0;
LAB_001125fa:
  if (captureStdErr != captureStdOut || captureStdErr == (string *)0x0) {
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
    timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
    super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
    super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((local_a8 != 0.0) || (NAN(local_a8))) {
      puVar9 = cmUVProcessChain::GetLoop(&chain);
      cm::uv_timer_ptr::init(&timer,(EVP_PKEY_CTX *)puVar9);
      uVar10 = (ulong)(local_a8 * 1000.0);
      cm::uv_timer_ptr::start
                (&timer,RunSingleCommand::anon_class_1_0_00000001::__invoke,
                 (long)(local_a8 * 1000.0 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10,0
                );
    }
    tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    errStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    errStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
    outputHandle._M_t.
    super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
    super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
    super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
          )(__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0;
    errorHandle._M_t.
    super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
    super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
    super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
          )(__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0;
    if ((outputflag_local != OUTPUT_PASSTHROUGH) &&
       (((captureStdErr != (string *)0x0 || (captureStdOut != (string *)0x0)) ||
        (outputflag_local != OUTPUT_NONE)))) {
      startRead.outputflag = &outputflag_local;
      startRead.processOutput = &processOutput;
      startRead.chain = &chain;
      uVar4 = cmUVProcessChain::OutputStream(&chain);
      RunSingleCommand::anon_class_24_3_3cd7b453::operator()
                ((anon_class_24_3_3cd7b453 *)local_1b8,(uv_pipe_ptr *)&startRead,(int)&outStream,
                 (string *)(ulong)uVar4,(vector<char,_std::allocator<char>_> *)captureStdOut,
                 (int)&tempStdOut,(_func_void_string_ptr *)0x1,(bool *)Stdout);
      uVar2 = outputHandle;
      outputHandle._M_t.
      super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
      super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
      super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
            )(__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
              )local_1b8;
      local_1b8 = (undefined1  [8])0x0;
      if ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)
          uVar2._M_t.
          super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
          _M_t.
          super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
          .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0) {
        std::default_delete<cmUVStreamReadHandle>::operator()
                  ((default_delete<cmUVStreamReadHandle> *)&outputHandle,
                   (cmUVStreamReadHandle *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                   .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl);
      }
      if (local_1b8 != (undefined1  [8])0x0) {
        std::default_delete<cmUVStreamReadHandle>::operator()
                  ((default_delete<cmUVStreamReadHandle> *)local_1b8,
                   (cmUVStreamReadHandle *)local_1b8);
      }
      iVar5 = cmUVProcessChain::OutputStream(&chain);
      iVar6 = cmUVProcessChain::ErrorStream(&chain);
      if (iVar5 != iVar6) {
        uVar4 = cmUVProcessChain::ErrorStream(&chain);
        RunSingleCommand::anon_class_24_3_3cd7b453::operator()
                  ((anon_class_24_3_3cd7b453 *)local_1b8,(uv_pipe_ptr *)&startRead,(int)&errStream,
                   (string *)(ulong)uVar4,(vector<char,_std::allocator<char>_> *)captureStdErr,
                   (int)&tempStdErr,(_func_void_string_ptr *)0x2,(bool *)Stderr);
        uVar2 = errorHandle;
        errorHandle._M_t.
        super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t
        .super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
        super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
              )(__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
                )local_1b8;
        local_1b8 = (undefined1  [8])0x0;
        if ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)
            uVar2._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0)
        {
          std::default_delete<cmUVStreamReadHandle>::operator()
                    ((default_delete<cmUVStreamReadHandle> *)&errorHandle,
                     (cmUVStreamReadHandle *)
                     uVar2._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl);
        }
        if (local_1b8 != (undefined1  [8])0x0) {
          std::default_delete<cmUVStreamReadHandle>::operator()
                    ((default_delete<cmUVStreamReadHandle> *)local_1b8,
                     (cmUVStreamReadHandle *)local_1b8);
        }
      }
    }
    while (bVar3 = cmUVProcessChain::Finished(&chain), !bVar3) {
      puVar9 = cmUVProcessChain::GetLoop(&chain);
      uv_run(puVar9,UV_RUN_ONCE);
    }
    if (captureStdOut != (string *)0x0) {
      pcVar1 = (captureStdOut->_M_dataplus)._M_p;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)captureStdOut,pcVar1,pcVar1 + captureStdOut->_M_string_length,
                 tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      pcVar1 = (captureStdOut->_M_dataplus)._M_p;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar1,pcVar1 + captureStdOut->_M_string_length);
      cmProcessOutput::DecodeText(&processOutput,&local_e8,captureStdOut,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    if (captureStdErr != (string *)0x0) {
      pcVar1 = (captureStdErr->_M_dataplus)._M_p;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)captureStdErr,pcVar1,pcVar1 + captureStdErr->_M_string_length,
                 tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      pcVar1 = (captureStdErr->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,pcVar1 + captureStdErr->_M_string_length);
      cmProcessOutput::DecodeText(&processOutput,&local_108,captureStdErr,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    this = cmUVProcessChain::GetStatus(&chain,0);
    cmUVProcessChain::Status::GetException_abi_cxx11_
              ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&startRead,this);
    if ((int)startRead.outputflag == 0) {
      if (retVal == (int *)0x0) {
        bVar3 = this->ExitStatus == 0;
      }
      else {
        *retVal = (int)this->ExitStatus;
        bVar3 = true;
      }
    }
    else {
      if (outputflag_local != OUTPUT_NONE) {
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)startRead.processOutput,
                             (long)startRead.chain);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      if (captureStdErr != (string *)0x0 || captureStdOut != (string *)0x0) {
        if (captureStdErr != (string *)0x0) {
          captureStdOut = captureStdErr;
        }
        std::__cxx11::string::_M_append((char *)captureStdOut,(ulong)startRead.processOutput);
      }
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)startRead.processOutput != &local_148) {
      operator_delete(startRead.processOutput,local_148._M_allocated_capacity + 1);
    }
    if ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)
        errorHandle._M_t.
        super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t
        .super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
        super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&errorHandle,
                 (cmUVStreamReadHandle *)
                 errorHandle._M_t.
                 super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                 .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl);
    }
    if ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)
        outputHandle._M_t.
        super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t
        .super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
        super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&outputHandle,
                 (cmUVStreamReadHandle *)
                 outputHandle._M_t.
                 super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                 .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl);
    }
    cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&errStream);
    cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&outStream);
    if (tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_timer_s> *)&timer);
    cmUVProcessChain::~cmUVProcessChain(&chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)builder.WorkingDirectory._M_dataplus._M_p != &builder.WorkingDirectory.field_2) {
      operator_delete(builder.WorkingDirectory._M_dataplus._M_p,
                      builder.WorkingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&builder.Processes);
    return bVar3;
  }
  __assert_fail("!captureStdErr || captureStdErr != captureStdOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx"
                ,0x254,
                "static bool cmSystemTools::RunSingleCommand(const std::vector<std::string> &, std::string *, std::string *, int *, const char *, OutputOption, cmDuration, Encoding)"
               );
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  cmUVProcessChainBuilder builder;
  builder.SetExternalStream(cmUVProcessChainBuilder::Stream_INPUT, stdin)
    .AddCommand(command);
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    captureStdOut = nullptr;
    captureStdErr = nullptr;
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    builder.SetMergedBuiltinStreams();
    captureStdErr = nullptr;
  } else {
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  auto chain = builder.Start();
  bool timedOut = false;
  cm::uv_timer_ptr timer;
  if (timeout.count()) {
    timer.init(chain.GetLoop(), &timedOut);
    timer.start(
      [](uv_timer_t* t) {
        auto* timedOutPtr = static_cast<bool*>(t->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);
  }

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  cm::uv_pipe_ptr outStream;
  bool outFinished = true;
  cm::uv_pipe_ptr errStream;
  bool errFinished = true;
  cmProcessOutput processOutput(encoding);
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    auto startRead =
      [&outputflag, &processOutput,
       &chain](cm::uv_pipe_ptr& pipe, int stream, std::string* captureStd,
               std::vector<char>& tempStd, int id,
               void (*outputFunc)(const std::string&),
               bool& finished) -> std::unique_ptr<cmUVStreamReadHandle> {
      if (stream < 0) {
        return nullptr;
      }

      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);

      finished = false;
      return cmUVStreamRead(
        pipe,
        [outputflag, &processOutput, captureStd, &tempStd, id,
         outputFunc](std::vector<char> data) {
          // Translate NULL characters in the output into valid text.
          for (auto& c : data) {
            if (c == '\0') {
              c = ' ';
            }
          }

          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(data.data(), data.size(), strdata, id);
            outputFunc(strdata);
          }
          if (captureStd) {
            cm::append(tempStd, data.data(), data.data() + data.size());
          }
        },
        [&finished, outputflag, &processOutput, id, outputFunc]() {
          finished = true;
          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(std::string(), strdata, id);
            if (!strdata.empty()) {
              outputFunc(strdata);
            }
          }
        });
    };

    outputHandle =
      startRead(outStream, chain.OutputStream(), captureStdOut, tempStdOut, 1,
                cmSystemTools::Stdout, outFinished);
    if (chain.OutputStream() != chain.ErrorStream()) {
      errorHandle =
        startRead(errStream, chain.ErrorStream(), captureStdErr, tempStdErr, 2,
                  cmSystemTools::Stderr, errFinished);
    }
  }

  while (!timedOut && !(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (timedOut) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();

    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (retVal) {
          *retVal = static_cast<int>(status.ExitStatus);
        } else {
          if (status.ExitStatus != 0) {
            result = false;
          }
        }
        break;
      default: {
        if (outputflag != OUTPUT_NONE) {
          std::cerr << exception.second << std::endl;
        }
        if (captureStdErr) {
          captureStdErr->append(exception.second);
        } else if (captureStdOut) {
          captureStdOut->append(exception.second);
        }
        result = false;
      } break;
    }
  }

  return result;
}